

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O2

void vkt::SpirVAssembly::createTestsForAllStages
               (string *name,RGBA (*inputColors) [4],RGBA (*outputColors) [4],
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *testCodeFragments,vector<int,_std::allocator<int>_> *specConstants,
               TestCaseGroup *tests,qpTestResult failResult,string *failMessageTemplate)

{
  mapped_type *pmVar1;
  long lVar2;
  StageToSpecConstantMap *specConstants_00;
  qpTestResult failResult_00;
  string *in_stack_fffffffffffff7b8;
  string local_840;
  allocator<char> local_81b;
  allocator<char> local_81a;
  allocator<char> local_819;
  string local_818;
  TestCaseGroup *local_7f8;
  ShaderElement (*local_7f0) [4];
  RGBA (*local_7e8) [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_7e0;
  StageToSpecConstantMap specConstantMap;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  ShaderElement geomPipelineStages [3];
  ShaderElement vertFragPipelineStages [2];
  ShaderElement tessPipelineStages [4];
  InstanceContext local_490;
  InstanceContext local_3b0;
  InstanceContext local_2d0;
  InstanceContext local_1f0;
  InstanceContext local_110;
  
  local_7f8 = tests;
  local_7f0 = (ShaderElement (*) [4])inputColors;
  local_7e8 = outputColors;
  local_7e0 = testCodeFragments;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)tessPipelineStages,"vert",(allocator<char> *)&local_818);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)geomPipelineStages,"main",(allocator<char> *)&local_7a8);
  ShaderElement::ShaderElement
            (vertFragPipelineStages,&tessPipelineStages[0].moduleName,
             &geomPipelineStages[0].moduleName,VK_SHADER_STAGE_VERTEX_BIT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&specConstantMap,"frag",(allocator<char> *)&local_768);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"main",(allocator<char> *)&local_788);
  ShaderElement::ShaderElement
            (vertFragPipelineStages + 1,(string *)&specConstantMap,&local_840,
             VK_SHADER_STAGE_FRAGMENT_BIT);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&specConstantMap);
  std::__cxx11::string::~string((string *)geomPipelineStages);
  std::__cxx11::string::~string((string *)tessPipelineStages);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)geomPipelineStages,"vert",(allocator<char> *)&stack0xfffffffffffff7bf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&specConstantMap,"main",(allocator<char> *)&stack0xfffffffffffff7be);
  ShaderElement::ShaderElement
            (tessPipelineStages,&geomPipelineStages[0].moduleName,(string *)&specConstantMap,
             VK_SHADER_STAGE_VERTEX_BIT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"tessc",(allocator<char> *)&stack0xfffffffffffff7bd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"main",(allocator<char> *)&stack0xfffffffffffff7bc);
  ShaderElement::ShaderElement
            (tessPipelineStages + 1,&local_840,&local_818,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"tesse",(allocator<char> *)&stack0xfffffffffffff7bb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"main",&local_819);
  ShaderElement::ShaderElement
            (tessPipelineStages + 2,&local_7a8,&local_768,
             VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"frag",&local_81a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"main",&local_81b);
  ShaderElement::ShaderElement
            (tessPipelineStages + 3,&local_788,&local_748,VK_SHADER_STAGE_FRAGMENT_BIT);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&specConstantMap);
  std::__cxx11::string::~string((string *)geomPipelineStages);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&specConstantMap,"vert",(allocator<char> *)&local_748);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"main",(allocator<char> *)&stack0xfffffffffffff7bf);
  ShaderElement::ShaderElement
            (geomPipelineStages,(string *)&specConstantMap,&local_840,VK_SHADER_STAGE_VERTEX_BIT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"geom",(allocator<char> *)&stack0xfffffffffffff7be);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"main",(allocator<char> *)&stack0xfffffffffffff7bd);
  ShaderElement::ShaderElement
            (geomPipelineStages + 1,&local_818,&local_7a8,VK_SHADER_STAGE_GEOMETRY_BIT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"frag",(allocator<char> *)&stack0xfffffffffffff7bc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"main",(allocator<char> *)&stack0xfffffffffffff7bb);
  ShaderElement::ShaderElement
            (geomPipelineStages + 2,&local_768,&local_788,VK_SHADER_STAGE_FRAGMENT_BIT);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&specConstantMap);
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header;
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_840._M_dataplus._M_p._0_4_ = 1;
  specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       specConstantMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar1 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](&specConstantMap,(key_type *)&local_840);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar1,specConstants);
  std::operator+(&local_840,name,"_vert");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"",(allocator<char> *)&local_7a8);
  specConstants_00 = (StageToSpecConstantMap *)(ulong)failResult;
  failResult_00 = (qpTestResult)failMessageTemplate;
  createInstanceContext<2ul>
            (&local_110,(SpirVAssembly *)vertFragPipelineStages,(ShaderElement (*) [2])local_7f0,
             local_7e8,(RGBA (*) [4])local_7e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,specConstants_00,failResult_00,in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (local_7f8,&local_840,&local_818,addShaderCodeCustomVertex,runAndVerifyDefaultPipeline,
             &local_110);
  InstanceContext::~InstanceContext(&local_110);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_840);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&specConstantMap._M_t);
  local_840._M_dataplus._M_p._0_4_ = 2;
  pmVar1 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)&specConstantMap._M_t,(key_type *)&local_840);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar1,specConstants);
  std::operator+(&local_840,name,"_tessc");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"",(allocator<char> *)&local_7a8);
  createInstanceContext<4ul>
            (&local_1f0,(SpirVAssembly *)tessPipelineStages,local_7f0,local_7e8,
             (RGBA (*) [4])local_7e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,specConstants_00,failResult_00,in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (local_7f8,&local_840,&local_818,addShaderCodeCustomTessControl,
             runAndVerifyDefaultPipeline,&local_1f0);
  InstanceContext::~InstanceContext(&local_1f0);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_840);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&specConstantMap._M_t);
  local_840._M_dataplus._M_p._0_4_ = 4;
  pmVar1 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)&specConstantMap._M_t,(key_type *)&local_840);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar1,specConstants);
  std::operator+(&local_840,name,"_tesse");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"",(allocator<char> *)&local_7a8);
  createInstanceContext<4ul>
            (&local_2d0,(SpirVAssembly *)tessPipelineStages,local_7f0,local_7e8,
             (RGBA (*) [4])local_7e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,specConstants_00,failResult_00,in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (local_7f8,&local_840,&local_818,addShaderCodeCustomTessEval,runAndVerifyDefaultPipeline
             ,&local_2d0);
  InstanceContext::~InstanceContext(&local_2d0);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_840);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&specConstantMap._M_t);
  local_840._M_dataplus._M_p._0_4_ = 8;
  pmVar1 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)&specConstantMap._M_t,(key_type *)&local_840);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar1,specConstants);
  std::operator+(&local_840,name,"_geom");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"",(allocator<char> *)&local_7a8);
  createInstanceContext<3ul>
            (&local_3b0,(SpirVAssembly *)geomPipelineStages,(ShaderElement (*) [3])local_7f0,
             local_7e8,(RGBA (*) [4])local_7e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,specConstants_00,failResult_00,in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (local_7f8,&local_840,&local_818,addShaderCodeCustomGeometry,runAndVerifyDefaultPipeline
             ,&local_3b0);
  InstanceContext::~InstanceContext(&local_3b0);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_840);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&specConstantMap._M_t);
  local_840._M_dataplus._M_p._0_4_ = 0x10;
  pmVar1 = std::
           map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)&specConstantMap._M_t,(key_type *)&local_840);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar1,specConstants);
  std::operator+(&local_840,name,"_frag");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"",(allocator<char> *)&local_7a8);
  createInstanceContext<2ul>
            (&local_490,(SpirVAssembly *)vertFragPipelineStages,(ShaderElement (*) [2])local_7f0,
             local_7e8,(RGBA (*) [4])local_7e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&specConstantMap,specConstants_00,failResult_00,in_stack_fffffffffffff7b8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (local_7f8,&local_840,&local_818,addShaderCodeCustomFragment,runAndVerifyDefaultPipeline
             ,&local_490);
  InstanceContext::~InstanceContext(&local_490);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_840);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&specConstantMap._M_t);
  lVar2 = 0x90;
  do {
    ShaderElement::~ShaderElement
              ((ShaderElement *)((long)&geomPipelineStages[0].moduleName._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != -0x48);
  lVar2 = 0xd8;
  do {
    ShaderElement::~ShaderElement
              ((ShaderElement *)((long)&tessPipelineStages[0].moduleName._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != -0x48);
  lVar2 = 0x48;
  do {
    ShaderElement::~ShaderElement
              ((ShaderElement *)
               ((long)&vertFragPipelineStages[0].moduleName._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != -0x48);
  return;
}

Assistant:

void createTestsForAllStages (const std::string&			name,
							  const RGBA					(&inputColors)[4],
							  const RGBA					(&outputColors)[4],
							  const map<string, string>&	testCodeFragments,
							  const vector<deInt32>&		specConstants,
							  tcu::TestCaseGroup*			tests,
							  const qpTestResult			failResult,
							  const string&					failMessageTemplate)
{
	const ShaderElement		vertFragPipelineStages[]		=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	const ShaderElement		tessPipelineStages[]			=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("tessc", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("tesse", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	const ShaderElement		geomPipelineStages[]				=
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("geom", "main", VK_SHADER_STAGE_GEOMETRY_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	StageToSpecConstantMap	specConstantMap;

	specConstantMap[VK_SHADER_STAGE_VERTEX_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_vert", "", addShaderCodeCustomVertex, runAndVerifyDefaultPipeline,
												 createInstanceContext(vertFragPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_tessc", "", addShaderCodeCustomTessControl, runAndVerifyDefaultPipeline,
												 createInstanceContext(tessPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_tesse", "", addShaderCodeCustomTessEval, runAndVerifyDefaultPipeline,
												 createInstanceContext(tessPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_GEOMETRY_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_geom", "", addShaderCodeCustomGeometry, runAndVerifyDefaultPipeline,
												 createInstanceContext(geomPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));

	specConstantMap.clear();
	specConstantMap[VK_SHADER_STAGE_FRAGMENT_BIT] = specConstants;
	addFunctionCaseWithPrograms<InstanceContext>(tests, name + "_frag", "", addShaderCodeCustomFragment, runAndVerifyDefaultPipeline,
												 createInstanceContext(vertFragPipelineStages, inputColors, outputColors, testCodeFragments, specConstantMap, failResult, failMessageTemplate));
}